

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O2

int __thiscall
LASreadItemCompressed_BYTE14_v3::init(LASreadItemCompressed_BYTE14_v3 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  U32 context;
  ByteStreamIn *pBVar2;
  U8 *pUVar3;
  long lVar4;
  undefined7 extraout_var;
  ByteStreamInArray **ppBVar5;
  ByteStreamInArray *pBVar6;
  ArithmeticDecoder **ppAVar7;
  ArithmeticDecoder *this_00;
  U32 *in_RDX;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  BOOL BVar11;
  
  pBVar2 = this->dec->instream;
  uVar10 = (ulong)this->number;
  if (this->instream_Bytes == (ByteStreamInArray **)0x0) {
    ppBVar5 = (ByteStreamInArray **)operator_new__(uVar10 * 8);
    this->instream_Bytes = ppBVar5;
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      pBVar6 = (ByteStreamInArray *)operator_new(0x38);
      (pBVar6->super_ByteStreamIn).bit_buffer = 0;
      (pBVar6->super_ByteStreamIn).num_buffer = 0;
      pBVar6->data = (U8 *)0x0;
      pBVar6->size = 0;
      pBVar6->curr = 0;
      pBVar6[1].super_ByteStreamIn._vptr_ByteStreamIn = (_func_int **)0x0;
      (pBVar6->super_ByteStreamIn)._vptr_ByteStreamIn = (_func_int **)&PTR_getByte_0015fc18;
      this->instream_Bytes[uVar8] = pBVar6;
    }
    ppAVar7 = (ArithmeticDecoder **)operator_new__(uVar10 * 8);
    this->dec_Bytes = ppAVar7;
    for (uVar8 = 0; uVar8 < uVar10; uVar8 = uVar8 + 1) {
      this_00 = (ArithmeticDecoder *)operator_new(0x10);
      ArithmeticDecoder::ArithmeticDecoder(this_00);
      this->dec_Bytes[uVar8] = this_00;
      uVar10 = (ulong)this->number;
    }
  }
  uVar9 = 0;
  for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    if (this->requested_Bytes[uVar8] == true) {
      uVar9 = uVar9 + this->num_bytes_Bytes[uVar8];
    }
  }
  if (this->num_bytes_allocated < uVar9) {
    if (this->bytes != (U8 *)0x0) {
      operator_delete__(this->bytes);
    }
    pUVar3 = (U8 *)operator_new__((ulong)uVar9);
    this->bytes = pUVar3;
    this->num_bytes_allocated = uVar9;
  }
  uVar9 = 0;
  for (uVar10 = 0; uVar10 < this->number; uVar10 = uVar10 + 1) {
    if (this->requested_Bytes[uVar10] == true) {
      if (this->num_bytes_Bytes[uVar10] == 0) {
        BVar11 = false;
        ArithmeticDecoder::init(this->dec_Bytes[uVar10],(EVP_PKEY_CTX *)0x0);
      }
      else {
        (*pBVar2->_vptr_ByteStreamIn[1])(pBVar2,this->bytes + uVar9);
        ppBVar5 = this->instream_Bytes;
        pBVar6 = ppBVar5[uVar10];
        pUVar3 = this->bytes;
        uVar1 = this->num_bytes_Bytes[uVar10];
        pBVar6->curr = 0;
        if (pUVar3 == (U8 *)0x0) {
          pBVar6->data = (U8 *)0x0;
          pBVar6->size = 0;
          ppBVar5 = this->instream_Bytes;
        }
        else {
          pBVar6->data = pUVar3 + uVar9;
          pBVar6->size = (ulong)uVar1;
        }
        ArithmeticDecoder::init(this->dec_Bytes[uVar10],(EVP_PKEY_CTX *)ppBVar5[uVar10]);
        uVar9 = uVar9 + this->num_bytes_Bytes[uVar10];
        BVar11 = true;
      }
    }
    else {
      if (this->num_bytes_Bytes[uVar10] != 0) {
        (*pBVar2->_vptr_ByteStreamIn[0xc])(pBVar2);
      }
      BVar11 = false;
    }
    this->changed_Bytes[uVar10] = BVar11;
  }
  for (lVar4 = 0x48; lVar4 != 0xa8; lVar4 = lVar4 + 0x18) {
    *(undefined1 *)
     ((long)&(((LASreadItemCompressed_BYTE14_v3 *)(this->contexts + -3))->
             super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem + lVar4) = 1;
  }
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndDecompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASreadItemCompressed_BYTE14_v3::init(const U8* item, U32& context)
{
  U32 i;

  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* on the first init create instreams and decoders */

  if (instream_Bytes == 0)
  {
    /* create instream pointer array */

    instream_Bytes = new ByteStreamInArray*[number];

    /* create instreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayBE();
      }
    }

    /* create decoder pointer array */

    dec_Bytes = new ArithmeticDecoder*[number];

    /* create layer decoders */

    for (i = 0; i < number; i++)
    {
      dec_Bytes[i] = new ArithmeticDecoder();
    }
  }

  /* how many bytes do we need to read */

  U32 num_bytes = 0;

  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i]) num_bytes += num_bytes_Bytes[i];
  }

  /* make sure the buffer is sufficiently large */

  if (num_bytes > num_bytes_allocated)
  {
    if (bytes) delete [] bytes;
    bytes = new U8[num_bytes];
    if (bytes == 0) return FALSE;
    num_bytes_allocated = num_bytes;
  }

  /* load the requested bytes and init the corresponding instreams an decoders */

  num_bytes = 0;
  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i])
    {
      if (num_bytes_Bytes[i])
      {
        instream->getBytes(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        instream_Bytes[i]->init(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        dec_Bytes[i]->init(instream_Bytes[i]);
        num_bytes += num_bytes_Bytes[i];
        changed_Bytes[i] = TRUE;
      }
      else
      {
        dec_Bytes[i]->init(0, 0);
        changed_Bytes[i] = FALSE;
      }
    }
    else
    {
      if (num_bytes_Bytes[i])
      {
        instream->skipBytes(num_bytes_Bytes[i]);
      }
      changed_Bytes[i] = FALSE;
    }
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 reader

  /* create and init models and decompressors */

  createAndInitModelsAndDecompressors(current_context, item);

  return TRUE;
}